

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbAbc.c
# Opt level: O2

Abc_Ntk_t * Acb_NtkToAbc(Abc_Ntk_t *pNtk,Acb_Ntk_t *p)

{
  Mem_Flex_t *pMan;
  int iVar1;
  Acb_ObjType_t AVar2;
  Abc_Ntk_t *pNtk_00;
  Vec_Int_t *p_00;
  Abc_Obj_t *pAVar3;
  char *pcVar4;
  Abc_Obj_t *pAVar5;
  int *piVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  
  iVar8 = 1;
  pNtk_00 = Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,ABC_FUNC_SOP);
  pMan = (Mem_Flex_t *)pNtk_00->pManFunc;
  p_00 = Vec_IntAlloc(1000);
  Vec_IntFill(&p->vObjCopy,(p->vObjType).nCap,-1);
  for (iVar11 = 0; iVar11 < (p->vCis).nSize; iVar11 = iVar11 + 1) {
    iVar1 = Vec_IntEntry(&p->vCis,iVar11);
    pAVar3 = Abc_NtkCi(pNtk_00,iVar11);
    Acb_ObjSetCopy(p,iVar1,pAVar3->Id);
  }
  uVar10 = 1;
  lVar9 = 8;
  do {
    if ((long)(p->vObjType).nSize <= (long)uVar10) {
      Vec_IntFree(p_00);
      do {
        if ((p->vObjType).nSize <= iVar8) {
          for (iVar8 = 0; iVar8 < (p->vCos).nSize; iVar8 = iVar8 + 1) {
            iVar11 = Vec_IntEntry(&p->vCos,iVar8);
            piVar6 = Acb_ObjFanins(p,iVar11);
            iVar11 = piVar6[1];
            pAVar3 = Abc_NtkCo(pNtk_00,iVar8);
            iVar11 = Acb_ObjCopy(p,iVar11);
            pAVar5 = Abc_NtkObj(pNtk_00,iVar11);
            Abc_ObjAddFanin(pAVar3,pAVar5);
          }
          iVar8 = Abc_NtkCheck(pNtk_00);
          if (iVar8 == 0) {
            puts("Acb_NtkToAbc: The network check has failed.");
            Abc_NtkDelete(pNtk_00);
            pNtk_00 = (Abc_Ntk_t *)0x0;
          }
          return pNtk_00;
        }
        AVar2 = Acb_ObjType(p,iVar8);
        if (AVar2 != ABC_OPER_NONE) {
          iVar11 = Acb_ObjIsCio(p,iVar8);
          if (iVar11 == 0) {
            iVar11 = Acb_ObjCopy(p,iVar8);
            pAVar3 = Abc_NtkObj(pNtk_00,iVar11);
            iVar11 = 0;
            while( true ) {
              iVar1 = Acb_ObjFaninNum(p,iVar8);
              if (iVar1 <= iVar11) break;
              iVar1 = Acb_ObjFanin(p,iVar8,iVar11);
              iVar1 = Acb_ObjCopy(p,iVar1);
              pAVar5 = Abc_NtkObj(pNtk_00,iVar1);
              Abc_ObjAddFanin(pAVar3,pAVar5);
              iVar11 = iVar11 + 1;
            }
            iVar11 = Abc_SopGetVarNum((char *)(pAVar3->field_5).pData);
            if (iVar11 != (pAVar3->vFanins).nSize) {
              __assert_fail("Abc_SopGetVarNum((char *)pObjNew->pData) == Abc_ObjFaninNum(pObjNew)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbAbc.c"
                            ,0x8c,"Abc_Ntk_t *Acb_NtkToAbc(Abc_Ntk_t *, Acb_Ntk_t *)");
            }
          }
        }
        iVar8 = iVar8 + 1;
      } while( true );
    }
    iVar11 = (int)uVar10;
    AVar2 = Acb_ObjType(p,iVar11);
    if (AVar2 != ABC_OPER_NONE) {
      iVar1 = Acb_ObjIsCio(p,iVar11);
      if (iVar1 == 0) {
        pAVar3 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_NODE);
        iVar1 = Acb_ObjFaninNum(p,iVar11);
        uVar7 = (ulong)(p->vObjTruth).nSize;
        if ((long)uVar7 < 1) {
          __assert_fail("Acb_NtkHasObjTruths(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                        ,0x10c,"word *Acb_ObjTruthP(Acb_Ntk_t *, int)");
        }
        if (uVar7 <= uVar10) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                        ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
        }
        pcVar4 = Abc_SopCreateFromTruthIsop
                           (pMan,iVar1,(word *)((long)(p->vObjTruth).pArray + lVar9),p_00);
        (pAVar3->field_5).pData = pcVar4;
        Acb_ObjSetCopy(p,iVar11,pAVar3->Id);
      }
    }
    uVar10 = uVar10 + 1;
    lVar9 = lVar9 + 8;
  } while( true );
}

Assistant:

Abc_Ntk_t * Acb_NtkToAbc( Abc_Ntk_t * pNtk, Acb_Ntk_t * p )
{
    int i, k, iObj, iFanin;
    Abc_Ntk_t * pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_LOGIC, ABC_FUNC_SOP );
    Mem_Flex_t * pMan = (Mem_Flex_t *)pNtkNew->pManFunc;
    Vec_Int_t * vCover = Vec_IntAlloc( 1000 );
    Acb_NtkCleanObjCopies( p );
    Acb_NtkForEachCi( p, iObj, i )
        Acb_ObjSetCopy( p, iObj, Abc_ObjId(Abc_NtkCi(pNtkNew, i)) );
    Acb_NtkForEachNode( p, iObj )
    {
        Abc_Obj_t * pObjNew = Abc_NtkCreateNode( pNtkNew );
        pObjNew->pData = Abc_SopCreateFromTruthIsop( pMan, Acb_ObjFaninNum(p, iObj), Acb_ObjTruthP(p, iObj), vCover );
        Acb_ObjSetCopy( p, iObj, Abc_ObjId(pObjNew) );
    }
    Vec_IntFree( vCover );
    Acb_NtkForEachNode( p, iObj )
    {
        Abc_Obj_t * pObjNew = Abc_NtkObj(pNtkNew, Acb_ObjCopy(p, iObj));
        Acb_ObjForEachFanin( p, iObj, iFanin, k )
            Abc_ObjAddFanin( pObjNew, Abc_NtkObj(pNtkNew, Acb_ObjCopy(p, iFanin)) );
        assert( Abc_SopGetVarNum((char *)pObjNew->pData) == Abc_ObjFaninNum(pObjNew) );
    }
    Acb_NtkForEachCoDriver( p, iFanin, i )
        Abc_ObjAddFanin( Abc_NtkCo(pNtkNew, i), Abc_NtkObj(pNtkNew, Acb_ObjCopy(p, iFanin)) );
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Acb_NtkToAbc: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}